

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption
          (OptionInterpreter *this,Message *options,vector<int,_std::allocator<int>_> *src_path,
          vector<int,_std::allocator<int>_> *options_path)

{
  FieldDescriptor **ppFVar1;
  UninterpretedOption *pUVar2;
  void *pvVar3;
  DescriptorBuilder *pDVar4;
  _Alloc_hider __ptr;
  const_iterator intermediate_fields_iter;
  Message *pMVar5;
  OptionInterpreter *pOVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  LogMessage *pLVar10;
  undefined4 extraout_var;
  Symbol this_00;
  undefined4 extraout_var_00;
  Type *pTVar11;
  long *plVar12;
  UnknownFieldSet *pUVar13;
  string *target;
  mapped_type *pmVar14;
  undefined8 *puVar15;
  mapped_type *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  code *pcVar17;
  Reflection *this_02;
  Reflection *this_03;
  DescriptorBuilder *pDVar18;
  undefined8 uVar19;
  ulong uVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  iterator iVar22;
  ConstStringParam key;
  FieldDescriptor *field;
  size_type __dnew;
  CodedOutputStream out;
  StringOutputStream outstr;
  unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  unknown_fields;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  intermediate_fields;
  vector<int,_std::allocator<int>_> dest_path;
  string debug_msg_name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  undefined1 local_1c0 [56];
  undefined1 local_188 [64];
  uint8_t *local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  const_iterator local_f8;
  iterator iStack_f0;
  FieldDescriptor **local_e8;
  vector<int,_std::allocator<int>_> local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  long local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  Message *local_a8;
  string local_a0;
  OptionInterpreter *local_80;
  vector<int,_std::allocator<int>_> *local_78;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pUVar2 = this->uninterpreted_option_;
  iVar8 = (pUVar2->name_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar8 == 0) {
    local_188._0_8_ = local_188 + 0x10;
    local_1c0._0_8_ = (char *)0x18;
    local_188._0_8_ = std::__cxx11::string::_M_create((ulong *)local_188,(ulong)local_1c0);
    local_188._16_8_ = local_1c0._0_8_;
    builtin_strncpy((char *)local_188._0_8_,"Option must have a name.",0x18);
    local_188._8_8_ = local_1c0._0_8_;
    *(char *)(local_188._0_8_ + local_1c0._0_8_) = '\0';
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_188);
LAB_0035de5d:
    if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
      operator_delete((void *)local_188._0_8_);
    }
    return false;
  }
  local_78 = src_path;
  if (iVar8 < 1) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_188,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x358);
    pLVar10 = internal::LogMessage::operator<<
                        ((LogMessage *)local_188,"CHECK failed: (index) < (current_size_): ");
    internal::LogFinisher::operator=((LogFinisher *)local_1c0,pLVar10);
    internal::LogMessage::~LogMessage((LogMessage *)local_188);
  }
  iVar8 = std::__cxx11::string::compare
                    ((char *)(*(ulong *)((long)((pUVar2->name_).super_RepeatedPtrFieldBase.rep_)->
                                               elements[0] + 0x18) & 0xfffffffffffffffe));
  if (iVar8 == 0) {
    local_188._0_8_ = local_188 + 0x10;
    local_1c0._0_8_ = (char *)0x39;
    local_188._0_8_ = std::__cxx11::string::_M_create((ulong *)local_188,(ulong)local_1c0);
    local_188._16_8_ = local_1c0._0_8_;
    builtin_strncpy((char *)local_188._0_8_,
                    "Option must not use reserved name \"uninterpreted_option\".",0x39);
    local_188._8_8_ = local_1c0._0_8_;
    *(char *)(local_188._0_8_ + local_1c0._0_8_) = '\0';
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_188);
    goto LAB_0035de5d;
  }
  pDVar18 = this->builder_;
  iVar8 = (*(options->super_MessageLite)._vptr_MessageLite[0x11])(options);
  this_00 = FindSymbolNotEnforcingDeps
                      (pDVar18,(string *)(*(long *)(CONCAT44(extraout_var,iVar8) + 8) + 0x20),true);
  if ((this_00.ptr_ == (SymbolBase *)0x0) || ((this_00.ptr_)->symbol_type_ != '\x01')) {
    iVar8 = (*(options->super_MessageLite)._vptr_MessageLite[0x11])(options);
    this_00.ptr_ = (SymbolBase *)CONCAT44(extraout_var_00,iVar8);
    if ((DescriptorBuilder *)this_00.ptr_ == (DescriptorBuilder *)0x0) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_188,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                 ,0x1bb0);
      pLVar10 = internal::LogMessage::operator<<
                          ((LogMessage *)local_188,"CHECK failed: options_descriptor: ");
      internal::LogFinisher::operator=((LogFinisher *)local_1c0,pLVar10);
      internal::LogMessage::~LogMessage((LogMessage *)local_188);
      this_00.ptr_ = (SymbolBase *)0x0;
    }
  }
  local_1c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  local_e8 = (FieldDescriptor **)0x0;
  local_f8._M_current = (FieldDescriptor **)0x0;
  iStack_f0._M_current = (FieldDescriptor **)0x0;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_a8 = options;
  std::vector<int,_std::allocator<int>_>::vector(&local_e0,options_path);
  if (0 < (this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase.current_size_) {
    iVar8 = 0;
    do {
      pDVar18 = this->builder_;
      (pDVar18->undefine_resolved_name_)._M_string_length = 0;
      *(pDVar18->undefine_resolved_name_)._M_dataplus._M_p = '\0';
      pTVar11 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                          (&(this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase,iVar8);
      pvVar3 = (pTVar11->name_part_).tagged_ptr_.ptr_;
      if (local_a0._M_string_length != 0) {
        std::__cxx11::string::append((char *)&local_a0);
      }
      pTVar11 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                          (&(this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase,iVar8);
      key = (ConstStringParam)((ulong)pvVar3 & 0xfffffffffffffffe);
      if (pTVar11->is_extension_ == true) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c0,"(",key);
        plVar12 = (long *)std::__cxx11::string::append((char *)local_1c0);
        local_188._0_8_ = local_188 + 0x10;
        pcVar17 = (code *)(plVar12 + 2);
        if ((code *)*plVar12 == pcVar17) {
          local_188._16_8_ = *(undefined8 *)pcVar17;
          local_188._24_8_ = plVar12[3];
        }
        else {
          local_188._16_8_ = *(undefined8 *)pcVar17;
          local_188._0_8_ = (code *)*plVar12;
        }
        local_188._8_8_ = plVar12[1];
        *plVar12 = (long)pcVar17;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_a0,local_188._0_8_);
        if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
          operator_delete((void *)local_188._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_1c0 + 0x10)) {
          operator_delete((void *)local_1c0._0_8_);
        }
        pDVar18 = this->builder_;
        local_1c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)LookupSymbol(pDVar18,key,&this->options_to_interpret_->name_scope,
                                    PLACEHOLDER_MESSAGE,LOOKUP_ALL,true);
        if ((local_1c8 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0) && (((SymbolBase *)local_1c8)->symbol_type_ == '\x02')) goto LAB_0035e076;
        local_1c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
LAB_0035e489:
        if (this->builder_->pool_->allow_unknown_ != true) {
          if ((this->builder_->undefine_resolved_name_)._M_string_length == 0) {
            std::operator+(&local_138,"Option \"",&local_a0);
            puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
            paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar15 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar15 == paVar16) {
              local_1c0._16_8_ = paVar16->_M_allocated_capacity;
              local_1c0._24_8_ = puVar15[3];
              local_1c0._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_1c0 + 0x10);
            }
            else {
              local_1c0._16_8_ = paVar16->_M_allocated_capacity;
              local_1c0._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar15;
            }
            local_1c0._8_8_ = puVar15[1];
            *puVar15 = paVar16;
            puVar15[1] = 0;
            *(undefined1 *)(puVar15 + 2) = 0;
            puVar15 = (undefined8 *)std::__cxx11::string::append(local_1c0);
            pcVar17 = (code *)(puVar15 + 2);
            if ((code *)*puVar15 == pcVar17) {
              local_188._16_8_ = *(undefined8 *)pcVar17;
              local_188._24_8_ = puVar15[3];
              local_188._0_8_ = local_188 + 0x10;
            }
            else {
              local_188._16_8_ = *(undefined8 *)pcVar17;
              local_188._0_8_ = (code *)*puVar15;
            }
            local_188._8_8_ = puVar15[1];
            *puVar15 = pcVar17;
            puVar15[1] = 0;
            *(undefined1 *)(puVar15 + 2) = 0;
            AddError(this->builder_,&this->options_to_interpret_->element_name,
                     &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_188);
            if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
              operator_delete((void *)local_188._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_1c0 + 0x10)) {
              operator_delete((void *)local_1c0._0_8_);
            }
            paVar16 = &local_138.field_2;
          }
          else {
            std::operator+(&local_50,"Option \"",&local_a0);
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_50);
            paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 == paVar16) {
              local_b8._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_b8._8_8_ = plVar12[3];
              local_c8 = &local_b8;
            }
            else {
              local_b8._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)*plVar12;
            }
            local_c0 = plVar12[1];
            *plVar12 = (long)paVar16;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            plVar12 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_c8,
                                         (ulong)(this->builder_->undefine_resolved_name_).
                                                _M_dataplus._M_p);
            paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 == paVar16) {
              local_118.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_118.field_2._8_8_ = plVar12[3];
              local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            }
            else {
              local_118.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_118._M_dataplus._M_p = (pointer)*plVar12;
            }
            local_118._M_string_length = plVar12[1];
            *plVar12 = (long)paVar16;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
            paVar16 = &local_138.field_2;
            paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar15 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar15 == paVar21) {
              local_138.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
              local_138.field_2._8_8_ = puVar15[3];
              local_138._M_dataplus._M_p = (pointer)paVar16;
            }
            else {
              local_138.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
              local_138._M_dataplus._M_p = (pointer)*puVar15;
            }
            local_138._M_string_length = puVar15[1];
            *puVar15 = paVar21;
            puVar15[1] = 0;
            *(undefined1 *)(puVar15 + 2) = 0;
            std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_a0);
            uVar19 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != paVar16) {
              uVar19 = local_138.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar19 < local_138._M_string_length + local_68) {
              uVar20 = 0xf;
              if (local_70 != local_60) {
                uVar20 = local_60[0];
              }
              if (uVar20 < local_138._M_string_length + local_68) goto LAB_0035ea5e;
              puVar15 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_70,0,(char *)0x0,(ulong)local_138._M_dataplus._M_p)
              ;
            }
            else {
LAB_0035ea5e:
              puVar15 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_70);
            }
            paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar15 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar15 == paVar21) {
              local_1c0._16_8_ = paVar21->_M_allocated_capacity;
              local_1c0._24_8_ = puVar15[3];
              local_1c0._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_1c0 + 0x10);
            }
            else {
              local_1c0._16_8_ = paVar21->_M_allocated_capacity;
              local_1c0._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar15;
            }
            local_1c0._8_8_ = puVar15[1];
            *puVar15 = paVar21;
            puVar15[1] = 0;
            paVar21->_M_local_buf[0] = '\0';
            puVar15 = (undefined8 *)std::__cxx11::string::append(local_1c0);
            pcVar17 = (code *)(puVar15 + 2);
            if ((code *)*puVar15 == pcVar17) {
              local_188._16_8_ = *(undefined8 *)pcVar17;
              local_188._24_8_ = puVar15[3];
              local_188._0_8_ = local_188 + 0x10;
            }
            else {
              local_188._16_8_ = *(undefined8 *)pcVar17;
              local_188._0_8_ = (code *)*puVar15;
            }
            local_188._8_8_ = puVar15[1];
            *puVar15 = pcVar17;
            puVar15[1] = 0;
            *(undefined1 *)(puVar15 + 2) = 0;
            AddError(this->builder_,&this->options_to_interpret_->element_name,
                     &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_188);
            if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
              operator_delete((void *)local_188._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_1c0 + 0x10)) {
              operator_delete((void *)local_1c0._0_8_);
            }
            if (local_70 != local_60) {
              operator_delete(local_70);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != paVar16) {
              operator_delete(local_138._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p);
            }
            if (local_c8 != &local_b8) {
              operator_delete(local_c8);
            }
            paVar16 = &local_50.field_2;
          }
          goto LAB_0035ecfd;
        }
LAB_0035e523:
        bVar7 = true;
        AddWithoutInterpreting((OptionInterpreter *)pDVar18,this->uninterpreted_option_,local_a8);
        goto LAB_0035ed0d;
      }
      std::__cxx11::string::_M_append((char *)&local_a0,(ulong)(key->_M_dataplus)._M_p);
      pDVar18 = (DescriptorBuilder *)this_00.ptr_;
      local_1c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)Descriptor::FindFieldByName((Descriptor *)this_00.ptr_,key);
      if (local_1c8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) goto LAB_0035e489;
LAB_0035e076:
      pDVar4 = *(DescriptorBuilder **)(local_1c8->_M_local_buf + 0x20);
      if (pDVar4 != (DescriptorBuilder *)this_00.ptr_) {
        if ((pDVar4 != (DescriptorBuilder *)0x0) && (((ulong)pDVar4->pool_ & 0x100) != 0))
        goto LAB_0035e523;
        std::operator+(&local_118,"Option field \"",&local_a0);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_118);
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 == paVar16) {
          local_138.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_138.field_2._8_8_ = plVar12[3];
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        }
        else {
          local_138.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_138._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_138._M_string_length = plVar12[1];
        *plVar12 = (long)paVar16;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        puVar15 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_138,
                             (ulong)(((DescriptorBuilder *)this_00.ptr_)->tables_->pending_files_).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar15 == paVar16) {
          local_1c0._16_8_ = paVar16->_M_allocated_capacity;
          local_1c0._24_8_ = puVar15[3];
          local_1c0._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_1c0 + 0x10);
        }
        else {
          local_1c0._16_8_ = paVar16->_M_allocated_capacity;
          local_1c0._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar15;
        }
        local_1c0._8_8_ = puVar15[1];
        *puVar15 = paVar16;
        puVar15[1] = 0;
        *(undefined1 *)(puVar15 + 2) = 0;
        puVar15 = (undefined8 *)std::__cxx11::string::append(local_1c0);
        pcVar17 = (code *)(puVar15 + 2);
        if ((code *)*puVar15 == pcVar17) {
          local_188._16_8_ = *(undefined8 *)pcVar17;
          local_188._24_8_ = puVar15[3];
          local_188._0_8_ = local_188 + 0x10;
        }
        else {
          local_188._16_8_ = *(undefined8 *)pcVar17;
          local_188._0_8_ = (code *)*puVar15;
        }
        local_188._8_8_ = puVar15[1];
        *puVar15 = pcVar17;
        puVar15[1] = 0;
        *(undefined1 *)(puVar15 + 2) = 0;
        AddError(this->builder_,&this->options_to_interpret_->element_name,
                 &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_188);
        if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
          operator_delete((void *)local_188._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_1c0 + 0x10)) {
          operator_delete((void *)local_1c0._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        paVar16 = &local_118.field_2;
LAB_0035ecfd:
        paVar21 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)(paVar16->_M_local_buf + -0x10);
        if (paVar21 != paVar16) {
LAB_0035ed06:
          operator_delete(paVar21);
        }
        goto LAB_0035ed0b;
      }
      local_188._0_4_ = *(int *)(local_1c8->_M_local_buf + 4);
      if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_e0,
                   (iterator)
                   local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)local_188);
      }
      else {
        *local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = *(int *)(local_1c8->_M_local_buf + 4);
        local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      paVar16 = local_1c8;
      iVar9 = (this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase.current_size_;
      if (iVar8 < iVar9 + -1) {
        if (*(once_flag **)(local_1c8->_M_local_buf + 0x18) != (once_flag *)0x0) {
          local_188._0_8_ = FieldDescriptor::TypeOnceInit;
          local_1c0._0_8_ = local_1c8;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(local_1c8->_M_local_buf + 0x18),
                     (_func_void_FieldDescriptor_ptr **)local_188,(FieldDescriptor **)local_1c0);
        }
        if (((byte)*(FieldDescriptor *)(paVar16->_M_local_buf + 2) & 0xfe) == 10) {
          if ((~(byte)*(FieldDescriptor *)(local_1c8->_M_local_buf + 1) & 0x60) != 0) {
            if (iStack_f0._M_current == local_e8) {
              std::
              vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                        ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                          *)&local_f8,iStack_f0,(FieldDescriptor **)&local_1c8);
            }
            else {
              *iStack_f0._M_current = (FieldDescriptor *)local_1c8;
              iStack_f0._M_current = iStack_f0._M_current + 1;
            }
            this_00.ptr_ = (SymbolBase *)
                           FieldDescriptor::message_type((FieldDescriptor *)local_1c8->_M_local_buf)
            ;
            iVar9 = (this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase.current_size_;
            goto LAB_0035e15e;
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1c0,"Option field \"",&local_a0);
          puVar15 = (undefined8 *)std::__cxx11::string::append(local_1c0);
          local_188._0_8_ = local_188 + 0x10;
          pcVar17 = (code *)(puVar15 + 2);
          if ((code *)*puVar15 == pcVar17) {
            local_188._16_8_ = *(undefined8 *)pcVar17;
            local_188._24_8_ = puVar15[3];
          }
          else {
            local_188._16_8_ = *(undefined8 *)pcVar17;
            local_188._0_8_ = (code *)*puVar15;
          }
          local_188._8_8_ = puVar15[1];
          *puVar15 = pcVar17;
          puVar15[1] = 0;
          *(undefined1 *)(puVar15 + 2) = 0;
          AddError(this->builder_,&this->options_to_interpret_->element_name,
                   &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_188);
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1c0,"Option \"",&local_a0);
          puVar15 = (undefined8 *)std::__cxx11::string::append(local_1c0);
          local_188._0_8_ = local_188 + 0x10;
          pcVar17 = (code *)(puVar15 + 2);
          if ((code *)*puVar15 == pcVar17) {
            local_188._16_8_ = *(undefined8 *)pcVar17;
            local_188._24_8_ = puVar15[3];
          }
          else {
            local_188._16_8_ = *(undefined8 *)pcVar17;
            local_188._0_8_ = (code *)*puVar15;
          }
          local_188._8_8_ = puVar15[1];
          *puVar15 = pcVar17;
          puVar15[1] = 0;
          *(undefined1 *)(puVar15 + 2) = 0;
          AddError(this->builder_,&this->options_to_interpret_->element_name,
                   &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_188);
        }
        if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
          operator_delete((void *)local_188._0_8_);
        }
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_1c0 + 0x10)) goto LAB_0035ed06;
        goto LAB_0035ed0b;
      }
LAB_0035e15e:
      iVar8 = iVar8 + 1;
    } while (iVar8 < iVar9);
  }
  pMVar5 = local_a8;
  iVar22._M_current = iStack_f0._M_current;
  intermediate_fields_iter._M_current = local_f8._M_current;
  paVar16 = local_1c8;
  if ((~local_1c8->_M_local_buf[1] & 0x60U) != 0) {
    (*(local_a8->super_MessageLite)._vptr_MessageLite[0x11])(local_a8);
    pUVar13 = Reflection::GetUnknownFields(this_02,pMVar5);
    bVar7 = ExamineIfOptionIsSet
                      (this,intermediate_fields_iter,(const_iterator)iVar22._M_current,
                       (FieldDescriptor *)paVar16->_M_local_buf,&local_a0,pUVar13);
    if (!bVar7) {
LAB_0035ed0b:
      bVar7 = false;
      goto LAB_0035ed0d;
    }
  }
  local_118._M_dataplus._M_p = (pointer)operator_new(0x18);
  *(size_type *)local_118._M_dataplus._M_p = 0;
  *(pointer *)((long)local_118._M_dataplus._M_p + 8) = (pointer)0x0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)local_118._M_dataplus._M_p + 0x10))->_M_allocated_capacity = 0;
  bVar7 = SetOptionValue(this,(FieldDescriptor *)local_1c8->_M_local_buf,
                         (UnknownFieldSet *)local_118._M_dataplus._M_p);
  if (bVar7) {
    local_80 = this;
    if (iStack_f0._M_current != local_f8._M_current) {
      iVar22._M_current = iStack_f0._M_current;
      do {
        local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)operator_new(0x18);
        local_c8->_M_allocated_capacity = 0;
        *(undefined8 *)((long)local_c8 + 8) = 0;
        local_c8[1]._M_allocated_capacity = 0;
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)iVar22._M_current[-1];
        if (*(once_flag **)(paVar16->_M_local_buf + 0x18) != (once_flag *)0x0) {
          local_188._0_8_ = FieldDescriptor::TypeOnceInit;
          local_1c0._0_8_ = paVar16;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(paVar16->_M_local_buf + 0x18),
                     (_func_void_FieldDescriptor_ptr **)local_188,(FieldDescriptor **)local_1c0);
        }
        ppFVar1 = iVar22._M_current + -1;
        if (*(FieldDescriptor *)(paVar16->_M_local_buf + 2) == (FieldDescriptor)0xa) {
          pUVar13 = UnknownFieldSet::AddGroup((UnknownFieldSet *)local_c8,*(int *)(*ppFVar1 + 4));
          UnknownFieldSet::MergeFrom(pUVar13,(UnknownFieldSet *)local_118._M_dataplus._M_p);
        }
        else {
          if (*(FieldDescriptor *)(paVar16->_M_local_buf + 2) != (FieldDescriptor)0xb) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_188,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x1c46);
            pLVar10 = internal::LogMessage::operator<<
                                ((LogMessage *)local_188,"Invalid wire type for CPPTYPE_MESSAGE: ");
            paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)iVar22._M_current[-1];
            if (*(once_flag **)(paVar16->_M_local_buf + 0x18) != (once_flag *)0x0) {
              local_1c0._0_8_ = FieldDescriptor::TypeOnceInit;
              local_138._M_dataplus._M_p = (pointer)paVar16;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (*(once_flag **)(paVar16->_M_local_buf + 0x18),
                         (_func_void_FieldDescriptor_ptr **)local_1c0,(FieldDescriptor **)&local_138
                        );
            }
            pLVar10 = internal::LogMessage::operator<<(pLVar10,(uint)(byte)paVar16->_M_local_buf[2])
            ;
            internal::LogFinisher::operator=((LogFinisher *)local_1c0,pLVar10);
            internal::LogMessage::~LogMessage((LogMessage *)local_188);
            if (local_c8 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              std::default_delete<google::protobuf::UnknownFieldSet>::operator()
                        ((default_delete<google::protobuf::UnknownFieldSet> *)&local_c8,
                         (UnknownFieldSet *)local_c8);
            }
            goto LAB_0035e765;
          }
          target = UnknownFieldSet::AddLengthDelimited_abi_cxx11_
                             ((UnknownFieldSet *)local_c8,*(int *)(*ppFVar1 + 4));
          io::StringOutputStream::StringOutputStream((StringOutputStream *)&local_138,target);
          io::CodedOutputStream::CodedOutputStream
                    ((CodedOutputStream *)local_188,(ZeroCopyOutputStream *)&local_138,true);
          local_148 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                                ((UnknownFieldSet *)local_118._M_dataplus._M_p,local_148,
                                 (EpsCopyOutputStream *)local_188);
          bVar7 = io::CodedOutputStream::HadError((CodedOutputStream *)local_188);
          if (bVar7) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_1c0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x1c39);
            pLVar10 = internal::LogMessage::operator<<
                                ((LogMessage *)local_1c0,"CHECK failed: !out.HadError(): ");
            pLVar10 = internal::LogMessage::operator<<
                                (pLVar10,"Unexpected failure while serializing option submessage ");
            pLVar10 = internal::LogMessage::operator<<(pLVar10,&local_a0);
            pLVar10 = internal::LogMessage::operator<<(pLVar10,"\".");
            internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar10);
            internal::LogMessage::~LogMessage((LogMessage *)local_1c0);
          }
          io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_188);
        }
        paVar16 = local_c8;
        __ptr._M_p = local_118._M_dataplus._M_p;
        local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
        local_118._M_dataplus._M_p = (pointer)paVar16;
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)__ptr._M_p !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0) &&
           (std::default_delete<google::protobuf::UnknownFieldSet>::operator()
                      ((default_delete<google::protobuf::UnknownFieldSet> *)&local_118,
                       (UnknownFieldSet *)__ptr._M_p),
           local_c8 !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0)) {
          std::default_delete<google::protobuf::UnknownFieldSet>::operator()
                    ((default_delete<google::protobuf::UnknownFieldSet> *)&local_c8,
                     (UnknownFieldSet *)local_c8);
        }
        iVar22._M_current = ppFVar1;
      } while (ppFVar1 != local_f8._M_current);
    }
    pMVar5 = local_a8;
    (*(local_a8->super_MessageLite)._vptr_MessageLite[0x11])(local_a8);
    pOVar6 = local_80;
    pUVar13 = Reflection::MutableUnknownFields(this_03,pMVar5);
    UnknownFieldSet::MergeFrom(pUVar13,(UnknownFieldSet *)local_118._M_dataplus._M_p);
    if ((~(byte)*(FieldDescriptor *)(local_1c8->_M_local_buf + 1) & 0x60) == 0) {
      pmVar14 = std::
                map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                ::operator[](&pOVar6->repeated_option_counts_,&local_e0);
      iVar8 = *pmVar14;
      *pmVar14 = iVar8 + 1;
      local_188._0_4_ = iVar8;
      if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_e0,
                   (iterator)
                   local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)local_188);
      }
      else {
        *local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = iVar8;
        local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
    }
    this_01 = std::
              map<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](&pOVar6->interpreted_paths_,local_78);
    bVar7 = true;
    std::vector<int,_std::allocator<int>_>::operator=(this_01,&local_e0);
  }
  else {
LAB_0035e765:
    bVar7 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::default_delete<google::protobuf::UnknownFieldSet>::operator()
              ((default_delete<google::protobuf::UnknownFieldSet> *)&local_118,
               (UnknownFieldSet *)local_118._M_dataplus._M_p);
  }
LAB_0035ed0d:
  if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if (local_f8._M_current == (FieldDescriptor **)0x0) {
    return bVar7;
  }
  operator_delete(local_f8._M_current);
  return bVar7;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::InterpretSingleOption(
    Message* options, const std::vector<int>& src_path,
    const std::vector<int>& options_path) {
  // First do some basic validation.
  if (uninterpreted_option_->name_size() == 0) {
    // This should never happen unless the parser has gone seriously awry or
    // someone has manually created the uninterpreted option badly.
    return AddNameError("Option must have a name.");
  }
  if (uninterpreted_option_->name(0).name_part() == "uninterpreted_option") {
    return AddNameError(
        "Option must not use reserved name "
        "\"uninterpreted_option\".");
  }

  const Descriptor* options_descriptor = nullptr;
  // Get the options message's descriptor from the builder's pool, so that we
  // get the version that knows about any extension options declared in the file
  // we're currently building. The descriptor should be there as long as the
  // file we're building imported descriptor.proto.

  // Note that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
  // DescriptorPool::FindMessageTypeByName() because we're already holding the
  // pool's mutex, and the latter method locks it again.  We don't use
  // FindSymbol() because files that use custom options only need to depend on
  // the file that defines the option, not descriptor.proto itself.
  Symbol symbol = builder_->FindSymbolNotEnforcingDeps(
      options->GetDescriptor()->full_name());
  options_descriptor = symbol.descriptor();
  if (options_descriptor == nullptr) {
    // The options message's descriptor was not in the builder's pool, so use
    // the standard version from the generated pool. We're not holding the
    // generated pool's mutex, so we can search it the straightforward way.
    options_descriptor = options->GetDescriptor();
  }
  GOOGLE_CHECK(options_descriptor);

  // We iterate over the name parts to drill into the submessages until we find
  // the leaf field for the option. As we drill down we remember the current
  // submessage's descriptor in |descriptor| and the next field in that
  // submessage in |field|. We also track the fields we're drilling down
  // through in |intermediate_fields|. As we go, we reconstruct the full option
  // name in |debug_msg_name|, for use in error messages.
  const Descriptor* descriptor = options_descriptor;
  const FieldDescriptor* field = nullptr;
  std::vector<const FieldDescriptor*> intermediate_fields;
  std::string debug_msg_name = "";

  std::vector<int> dest_path = options_path;

  for (int i = 0; i < uninterpreted_option_->name_size(); ++i) {
    builder_->undefine_resolved_name_.clear();
    const std::string& name_part = uninterpreted_option_->name(i).name_part();
    if (debug_msg_name.size() > 0) {
      debug_msg_name += ".";
    }
    if (uninterpreted_option_->name(i).is_extension()) {
      debug_msg_name += "(" + name_part + ")";
      // Search for the extension's descriptor as an extension in the builder's
      // pool. Note that we use DescriptorBuilder::LookupSymbol(), not
      // DescriptorPool::FindExtensionByName(), for two reasons: 1) It allows
      // relative lookups, and 2) because we're already holding the pool's
      // mutex, and the latter method locks it again.
      symbol =
          builder_->LookupSymbol(name_part, options_to_interpret_->name_scope);
      field = symbol.field_descriptor();
      // If we don't find the field then the field's descriptor was not in the
      // builder's pool, but there's no point in looking in the generated
      // pool. We require that you import the file that defines any extensions
      // you use, so they must be present in the builder's pool.
    } else {
      debug_msg_name += name_part;
      // Search for the field's descriptor as a regular field.
      field = descriptor->FindFieldByName(name_part);
    }

    if (field == nullptr) {
      if (get_allow_unknown(builder_->pool_)) {
        // We can't find the option, but AllowUnknownDependencies() is enabled,
        // so we will just leave it as uninterpreted.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else if (!(builder_->undefine_resolved_name_).empty()) {
        // Option is resolved to a name which is not defined.
        return AddNameError(
            "Option \"" + debug_msg_name + "\" is resolved to \"(" +
            builder_->undefine_resolved_name_ +
            ")\", which is not defined. The innermost scope is searched first "
            "in name resolution. Consider using a leading '.'(i.e., \"(." +
            debug_msg_name.substr(1) +
            "\") to start from the outermost scope.");
      } else {
        return AddNameError(
            "Option \"" + debug_msg_name +
            "\" unknown. Ensure that your proto" +
            " definition file imports the proto which defines the option.");
      }
    } else if (field->containing_type() != descriptor) {
      if (get_is_placeholder(field->containing_type())) {
        // The field is an extension of a placeholder type, so we can't
        // reliably verify whether it is a valid extension to use here (e.g.
        // we don't know if it is an extension of the correct *Options message,
        // or if it has a valid field number, etc.).  Just leave it as
        // uninterpreted instead.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else {
        // This can only happen if, due to some insane misconfiguration of the
        // pools, we find the options message in one pool but the field in
        // another. This would probably imply a hefty bug somewhere.
        return AddNameError("Option field \"" + debug_msg_name +
                            "\" is not a field or extension of message \"" +
                            descriptor->name() + "\".");
      }
    } else {
      // accumulate field numbers to form path to interpreted option
      dest_path.push_back(field->number());

      if (i < uninterpreted_option_->name_size() - 1) {
        if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
          return AddNameError("Option \"" + debug_msg_name +
                              "\" is an atomic type, not a message.");
        } else if (field->is_repeated()) {
          return AddNameError("Option field \"" + debug_msg_name +
                              "\" is a repeated message. Repeated message "
                              "options must be initialized using an "
                              "aggregate value.");
        } else {
          // Drill down into the submessage.
          intermediate_fields.push_back(field);
          descriptor = field->message_type();
        }
      }
    }
  }

  // We've found the leaf field. Now we use UnknownFieldSets to set its value
  // on the options message. We do so because the message may not yet know
  // about its extension fields, so we may not be able to set the fields
  // directly. But the UnknownFieldSets will serialize to the same wire-format
  // message, so reading that message back in once the extension fields are
  // known will populate them correctly.

  // First see if the option is already set.
  if (!field->is_repeated() &&
      !ExamineIfOptionIsSet(
          intermediate_fields.begin(), intermediate_fields.end(), field,
          debug_msg_name,
          options->GetReflection()->GetUnknownFields(*options))) {
    return false;  // ExamineIfOptionIsSet() already added the error.
  }

  // First set the value on the UnknownFieldSet corresponding to the
  // innermost message.
  std::unique_ptr<UnknownFieldSet> unknown_fields(new UnknownFieldSet());
  if (!SetOptionValue(field, unknown_fields.get())) {
    return false;  // SetOptionValue() already added the error.
  }

  // Now wrap the UnknownFieldSet with UnknownFieldSets corresponding to all
  // the intermediate messages.
  for (std::vector<const FieldDescriptor*>::reverse_iterator iter =
           intermediate_fields.rbegin();
       iter != intermediate_fields.rend(); ++iter) {
    std::unique_ptr<UnknownFieldSet> parent_unknown_fields(
        new UnknownFieldSet());
    switch ((*iter)->type()) {
      case FieldDescriptor::TYPE_MESSAGE: {
        io::StringOutputStream outstr(
            parent_unknown_fields->AddLengthDelimited((*iter)->number()));
        io::CodedOutputStream out(&outstr);
        internal::WireFormat::SerializeUnknownFields(*unknown_fields, &out);
        GOOGLE_CHECK(!out.HadError())
            << "Unexpected failure while serializing option submessage "
            << debug_msg_name << "\".";
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
        parent_unknown_fields->AddGroup((*iter)->number())
            ->MergeFrom(*unknown_fields);
        break;
      }

      default:
        GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: "
                   << (*iter)->type();
        return false;
    }
    unknown_fields.reset(parent_unknown_fields.release());
  }

  // Now merge the UnknownFieldSet corresponding to the top-level message into
  // the options message.
  options->GetReflection()->MutableUnknownFields(options)->MergeFrom(
      *unknown_fields);

  // record the element path of the interpreted option
  if (field->is_repeated()) {
    int index = repeated_option_counts_[dest_path]++;
    dest_path.push_back(index);
  }
  interpreted_paths_[src_path] = dest_path;

  return true;
}